

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
emplace_back<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
          (SmallVectorBase<slang::ast::CoverageOptionSetter> *this,Scope *args,
          CoverageOptionSyntax *args_1)

{
  size_type sVar1;
  pointer pCVar2;
  
  sVar1 = this->len;
  pCVar2 = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    pCVar2 = emplaceRealloc<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
                       (this,pCVar2,args,args_1);
    return pCVar2;
  }
  (pCVar2->scope).ptr = args;
  (pCVar2->syntax).ptr = args_1;
  pCVar2->expr = (Expression *)0x0;
  this->len = sVar1 + 1;
  return pCVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }